

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::SomeHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  uint uVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Var pvVar5;
  RecyclableObject *callBackFn;
  undefined8 uVar6;
  JavascriptMethod p_Var7;
  long lVar8;
  undefined4 *puVar9;
  char16_t *varName;
  uint32 nValue;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_48;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a6425d:
    varName = L"[TypedArray].prototype.some";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.some";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar5 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar5);
  if (!bVar3) goto LAB_00a6425d;
  pvVar5 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar5);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_48 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_48 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
      goto LAB_00a640fc;
    }
  }
  else {
LAB_00a640fc:
    if (typedArrayBase != (TypedArrayBase *)0x0) {
      bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
      if (!bVar3) {
        bVar3 = VarIsImpl<Js::TypedArrayBase>((RecyclableObject *)typedArrayBase);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x238b,"(VarIsCorrectType(typedArrayBase))",
                                      "VarIsCorrectType(typedArrayBase)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
        Throw::FatalInternalError(-0x7fffbffb);
      }
      uVar1 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
      if (uVar1 < length) {
        length = uVar1;
      }
      nValue = 0;
      jsReentLock._24_8_ = typedArrayBase;
      do {
        if (length == nValue) {
          lVar8 = 0x3f0;
          goto LAB_00a64235;
        }
        uVar6 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))(jsReentLock._24_8_,nValue);
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        this = scriptContext->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var7);
        p_Var7 = RecyclableObject::GetEntryPoint(callBackFn);
        pvVar5 = JavascriptNumber::ToVar(nValue,scriptContext);
        pvVar5 = (*p_Var7)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_48,
                           uVar6,pvVar5,jsReentLock._24_8_);
        this->reentrancySafeOrHandled = bVar3;
        BVar4 = JavascriptConversion::ToBoolean(pvVar5,scriptContext);
        nValue = nValue + 1;
      } while (BVar4 == 0);
      lVar8 = 1000;
LAB_00a64235:
      pvVar5 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                               super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar8);
      goto LAB_00a64241;
    }
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar5 = SomeObjectHelper<unsigned_int>(obj,length,0,callBackFn,local_48,scriptContext);
LAB_00a64241:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar5;
}

Assistant:

Var JavascriptArray::SomeHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // We are in the TypedArray version of this API if and only if typedArrayBase != nullptr
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.some"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.some"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.some and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT_UNLOCK(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetFalse();
    }